

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O1

int GetCoeffsAlt(VP8BitReader *br,VP8BandProbas **prob,int ctx,int *dq,int n,int16_t *out)

{
  range_t rVar1;
  ulong *puVar2;
  VP8BandProbas *pVVar3;
  ushort uVar4;
  ushort uVar5;
  VP8ProbaArray *p;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  int iVar6;
  
  if (n < 0x10) {
    p = prob[n]->probas + ctx;
    do {
      bVar8 = (*p)[0];
      rVar1 = br->range;
      if (br->bits < 0) {
        puVar2 = (ulong *)br->buf;
        if (puVar2 < br->buf_max) {
          uVar11 = *puVar2;
          br->buf = (uint8_t *)((long)puVar2 + 7);
          br->value = br->value << 0x38 |
                      ((uVar11 & 0xff000000000000) >> 0x28 | (uVar11 & 0xff0000000000) >> 0x18 |
                       (uVar11 & 0xff00000000) >> 8 | (uVar11 & 0xff000000) << 8 |
                       (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38) >>
                      8;
          br->bits = br->bits + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
        }
      }
      bVar7 = (byte)br->bits;
      uVar12 = bVar8 * rVar1 >> 8;
      uVar10 = (uint)(br->value >> (bVar7 & 0x3f));
      uVar9 = uVar12;
      if (uVar12 < uVar10) {
        uVar9 = ~uVar12 + rVar1;
        br->value = br->value - ((ulong)uVar12 + 1 << (bVar7 & 0x3f));
      }
      if (uVar9 < 0x7f) {
        uVar11 = (ulong)uVar9;
        uVar9 = (uint)kVP8NewRange[uVar9];
        br->bits = br->bits -
                   (uint)"\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                         [uVar11];
      }
      br->range = uVar9;
      if (uVar10 <= uVar12) {
        return n;
      }
      lVar13 = (long)n;
      lVar16 = lVar13 << 0x20;
      while( true ) {
        n = n + 1;
        bVar8 = (*p)[1];
        rVar1 = br->range;
        if (br->bits < 0) {
          puVar2 = (ulong *)br->buf;
          if (puVar2 < br->buf_max) {
            uVar11 = *puVar2;
            br->buf = (uint8_t *)((long)puVar2 + 7);
            br->value = br->value << 0x38 |
                        ((uVar11 & 0xff000000000000) >> 0x28 | (uVar11 & 0xff0000000000) >> 0x18 |
                         (uVar11 & 0xff00000000) >> 8 | (uVar11 & 0xff000000) << 8 |
                         (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38)
                        >> 8;
            br->bits = br->bits + 0x38;
          }
          else {
            VP8LoadFinalBytes(br);
          }
        }
        bVar7 = (byte)br->bits;
        uVar12 = bVar8 * rVar1 >> 8;
        uVar10 = (uint)(br->value >> (bVar7 & 0x3f));
        uVar9 = uVar12;
        if (uVar12 < uVar10) {
          uVar9 = ~uVar12 + rVar1;
          br->value = br->value - ((ulong)uVar12 + 1 << (bVar7 & 0x3f));
        }
        if (uVar9 < 0x7f) {
          uVar11 = (ulong)uVar9;
          uVar9 = (uint)kVP8NewRange[uVar9];
          br->bits = br->bits -
                     (uint)"\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                           [uVar11];
        }
        br->range = uVar9;
        if (uVar12 < uVar10) break;
        p = (VP8ProbaArray *)prob[lVar13 + 1];
        lVar13 = lVar13 + 1;
        lVar16 = lVar16 + 0x100000000;
        if (lVar13 == 0x10) {
          return 0x10;
        }
      }
      pVVar3 = prob[n];
      bVar8 = (*p)[2];
      if (br->bits < 0) {
        puVar2 = (ulong *)br->buf;
        if (puVar2 < br->buf_max) {
          uVar11 = *puVar2;
          br->buf = (uint8_t *)((long)puVar2 + 7);
          br->value = br->value << 0x38 |
                      ((uVar11 & 0xff000000000000) >> 0x28 | (uVar11 & 0xff0000000000) >> 0x18 |
                       (uVar11 & 0xff00000000) >> 8 | (uVar11 & 0xff000000) << 8 |
                       (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38) >>
                      8;
          br->bits = br->bits + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
        }
      }
      bVar7 = (byte)br->bits;
      uVar14 = bVar8 * uVar9 >> 8;
      uVar12 = (uint)(br->value >> (bVar7 & 0x3f));
      uVar10 = uVar14;
      if (uVar14 < uVar12) {
        uVar10 = ~uVar14 + uVar9;
        br->value = br->value - ((ulong)uVar14 + 1 << (bVar7 & 0x3f));
      }
      if (uVar10 < 0x7f) {
        uVar11 = (ulong)uVar10;
        uVar10 = (uint)kVP8NewRange[uVar10];
        br->bits = br->bits -
                   (uint)"\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                         [uVar11];
      }
      br->range = uVar10;
      if (uVar14 < uVar12) {
        iVar6 = GetLargeValue(br,*p);
        uVar5 = (ushort)iVar6;
        lVar15 = 0x16;
      }
      else {
        uVar5 = 1;
        lVar15 = 0xb;
      }
      if (br->bits < 0) {
        puVar2 = (ulong *)br->buf;
        if (puVar2 < br->buf_max) {
          uVar11 = *puVar2;
          br->buf = (uint8_t *)((long)puVar2 + 7);
          br->value = br->value << 0x38 |
                      ((uVar11 & 0xff000000000000) >> 0x28 | (uVar11 & 0xff0000000000) >> 0x18 |
                       (uVar11 & 0xff00000000) >> 8 | (uVar11 & 0xff000000) << 8 |
                       (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38) >>
                      8;
          br->bits = br->bits + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
        }
      }
      p = (VP8ProbaArray *)(pVVar3->probas[0] + lVar15);
      uVar9 = br->range >> 1;
      bVar8 = (byte)br->bits;
      iVar6 = uVar9 - (int)(br->value >> (bVar8 & 0x3f));
      uVar10 = iVar6 >> 0x1f;
      br->bits = br->bits + -1;
      br->range = br->range + uVar10 | 1;
      br->value = br->value - ((ulong)(uVar9 + 1 & uVar10) << (bVar8 & 0x3f));
      uVar4 = (ushort)(iVar6 >> 0x1f);
      out[""[lVar16 >> 0x20]] = ((uVar5 ^ uVar4) - uVar4) * (short)dq[0 < lVar13];
    } while (lVar13 < 0xf);
  }
  return 0x10;
}

Assistant:

static int GetCoeffsAlt(VP8BitReader* const br,
                        const VP8BandProbas* const prob[],
                        int ctx, const quant_t dq, int n, int16_t* out) {
  const uint8_t* p = prob[n]->probas[ctx];
  for (; n < 16; ++n) {
    if (!VP8GetBitAlt(br, p[0], "coeffs")) {
      return n;  // previous coeff was last non-zero coeff
    }
    while (!VP8GetBitAlt(br, p[1], "coeffs")) {       // sequence of zero coeffs
      p = prob[++n]->probas[0];
      if (n == 16) return 16;
    }
    {        // non zero coeff
      const VP8ProbaArray* const p_ctx = &prob[n + 1]->probas[0];
      int v;
      if (!VP8GetBitAlt(br, p[2], "coeffs")) {
        v = 1;
        p = p_ctx[1];
      } else {
        v = GetLargeValue(br, p);
        p = p_ctx[2];
      }
      out[kZigzag[n]] = VP8GetSigned(br, v, "coeffs") * dq[n > 0];
    }
  }
  return 16;
}